

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O1

int GetLatestDataRazorAHRS(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  int iVar1;
  timespec *ptVar2;
  RAZORAHRS *pRVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  long lVar10;
  __time_t _Var11;
  __time_t _Var12;
  char cVar13;
  size_t sVar14;
  char *pcVar15;
  RAZORAHRSDATA *pRVar16;
  ulong uVar17;
  byte bVar18;
  timespec local_3c0;
  double local_3b0;
  RAZORAHRS *local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  CHRONO chrono;
  char recvbuf [512];
  char savebuf [256];
  
  bVar18 = 0;
  iVar4 = clock_getres(4,(timespec *)&chrono.Frequency);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,(timespec *)&chrono), iVar4 == 0)) {
    chrono.Suspended = 0;
    chrono.Finish.tv_sec = 0;
    chrono.Finish.tv_nsec = 0;
    chrono.Duration.tv_sec = 0;
    chrono.Duration.tv_nsec = 0;
  }
  memset(recvbuf,0,0x200);
  memset(savebuf,0,0x100);
  iVar4 = (pRazorAHRS->RS232Port).DevType;
  cVar13 = '\x01';
  if (iVar4 - 1U < 4) {
    uVar5 = recv((pRazorAHRS->RS232Port).s,recvbuf,0xff,0);
    if (-1 < (int)uVar5) {
      cVar13 = ((int)uVar5 == 0) * '\x02';
    }
  }
  else {
    uVar5 = 0;
    if (iVar4 == 0) {
      uVar5 = read(*(int *)&(pRazorAHRS->RS232Port).hDev,recvbuf,0xff);
      cVar13 = '\x01';
      if (-1 < (int)uVar5) {
        cVar13 = ((int)uVar5 == 0) * '\x02';
      }
    }
  }
  if (cVar13 == '\0') {
    iVar4 = (int)uVar5;
    if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,(long)iVar4,1,(FILE *)pRazorAHRS->pfSaveFile);
      fflush((FILE *)pRazorAHRS->pfSaveFile);
    }
    local_3a8 = pRazorAHRS;
    if (iVar4 < 0xff) {
      uVar17 = uVar5 & 0xffffffff;
      local_3b0 = (double)uVar5;
    }
    else {
      if (iVar4 == 0xff) {
        do {
          _Var11 = chrono.Duration.tv_sec;
          ptVar2 = (timespec *)&chrono.Duration;
          if (chrono.Suspended == 0) {
            clock_gettime(4,&local_3c0);
            local_3c0.tv_sec =
                 (local_3c0.tv_sec + chrono.Duration.tv_sec +
                 (local_3c0.tv_nsec + chrono.Duration.tv_nsec) / 1000000000) - chrono.Start.tv_sec;
            local_3c0.tv_nsec =
                 (local_3c0.tv_nsec + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec;
            if (local_3c0.tv_nsec < 0) {
              local_3c0.tv_sec = local_3c0.tv_sec + local_3c0.tv_nsec / 1000000000 + -1;
              local_3c0.tv_nsec = local_3c0.tv_nsec % 1000000000 + 1000000000;
            }
            _Var11 = local_3c0.tv_sec;
            ptVar2 = &local_3c0;
          }
          if (4.0 < (double)ptVar2->tv_nsec / 1000000000.0 + (double)_Var11) goto LAB_001053bc;
          memcpy(savebuf,recvbuf,uVar5 & 0xffffffff);
          iVar4 = (local_3a8->RS232Port).DevType;
          cVar13 = '\x01';
          if (iVar4 - 1U < 4) {
            uVar5 = recv((local_3a8->RS232Port).s,recvbuf,0xff,0);
            if (-1 < (int)uVar5) {
              cVar13 = ((int)uVar5 == 0) * '\x02';
            }
          }
          else if (iVar4 == 0) {
            uVar5 = read(*(int *)&(local_3a8->RS232Port).hDev,recvbuf,0xff);
            cVar13 = ((int)uVar5 == 0) * '\x02';
            if ((int)uVar5 < 0) {
              cVar13 = '\x01';
            }
          }
          pRVar3 = local_3a8;
          if (cVar13 != '\0') goto LAB_00104ae6;
          if ((local_3a8->bSaveRawData != 0) && ((FILE *)local_3a8->pfSaveFile != (FILE *)0x0)) {
            fwrite(recvbuf,(long)(int)uVar5,1,(FILE *)local_3a8->pfSaveFile);
            fflush((FILE *)pRVar3->pfSaveFile);
          }
        } while ((int)uVar5 == 0xff);
      }
      sVar14 = (size_t)(int)uVar5;
      local_3b0 = (double)uVar5;
      memmove(recvbuf + (0xff - sVar14),recvbuf,sVar14);
      uVar17 = 0xff;
      memcpy(recvbuf,savebuf + sVar14,(long)(0xff - (int)uVar5));
    }
    pcVar15 = strstr(recvbuf,"#YPR=");
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar6 = strstr(pcVar15 + 5,"\r\n");
      if (pcVar6 == (char *)0x0) {
        pcVar15 = (char *)0x0;
      }
    }
    if (pcVar15 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      do {
        pcVar6 = pcVar15;
        pcVar15 = strstr(pcVar6 + 5,"#YPR=");
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar7 = strstr(pcVar15 + 5,"\r\n");
          if (pcVar7 == (char *)0x0) {
            pcVar15 = (char *)0x0;
          }
        }
      } while (pcVar15 != (char *)0x0);
    }
    pcVar15 = strstr(recvbuf,"#YPRAG=");
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar7 = strstr(pcVar15 + 7,"\r\n");
      if (pcVar7 == (char *)0x0) {
        pcVar15 = (char *)0x0;
      }
    }
    if (pcVar15 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      do {
        pcVar7 = pcVar15;
        pcVar15 = strstr(pcVar7 + 7,"#YPRAG=");
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar8 = strstr(pcVar15 + 7,"\r\n");
          if (pcVar8 == (char *)0x0) {
            pcVar15 = (char *)0x0;
          }
        }
      } while (pcVar15 != (char *)0x0);
    }
    if (pcVar6 == (char *)0x0 && pcVar7 == (char *)0x0) {
      do {
        dVar9 = local_3b0;
        if (chrono.Suspended == 0) {
          clock_gettime(4,&local_3c0);
          local_3c0.tv_sec =
               (local_3c0.tv_sec + chrono.Duration.tv_sec +
               (local_3c0.tv_nsec + chrono.Duration.tv_nsec) / 1000000000) - chrono.Start.tv_sec;
          local_3c0.tv_nsec =
               (local_3c0.tv_nsec + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec;
          if (local_3c0.tv_nsec < 0) {
            local_3c0.tv_sec = local_3c0.tv_sec + local_3c0.tv_nsec / 1000000000 + -1;
            local_3c0.tv_nsec = local_3c0.tv_nsec % 1000000000 + 1000000000;
          }
          ptVar2 = &local_3c0;
          _Var12 = local_3c0.tv_sec;
        }
        else {
          ptVar2 = (timespec *)&chrono.Duration;
          _Var12 = chrono.Duration.tv_sec;
        }
        pRVar3 = local_3a8;
        if (4.0 < (double)ptVar2->tv_nsec / 1000000000.0 + (double)_Var12) {
LAB_001053bc:
          puts("Error reading data from a RazorAHRS : Message timeout. ");
          return 2;
        }
        iVar4 = (int)uVar17;
        if (0x1fe < iVar4) {
          puts("Error reading data from a RazorAHRS : Invalid data. ");
          return 4;
        }
        pcVar15 = recvbuf + iVar4;
        iVar1 = (local_3a8->RS232Port).DevType;
        cVar13 = '\x01';
        if (iVar1 - 1U < 4) {
          dVar9 = (double)recv((local_3a8->RS232Port).s,pcVar15,(long)(int)(0x1ffU - iVar4),0);
          if (-1 < SUB84(dVar9,0)) {
            cVar13 = (SUB84(dVar9,0) == 0) * '\x02';
          }
        }
        else if (iVar1 == 0) {
          dVar9 = (double)read(*(int *)&(local_3a8->RS232Port).hDev,pcVar15,(ulong)(0x1ffU - iVar4))
          ;
          cVar13 = (SUB84(dVar9,0) == 0) * '\x02';
          if (SUB84(dVar9,0) < 0) {
            cVar13 = '\x01';
          }
        }
        if (cVar13 != '\0') goto LAB_00104ae6;
        local_3b0 = dVar9;
        if ((pRVar3->bSaveRawData != 0) && ((FILE *)pRVar3->pfSaveFile != (FILE *)0x0)) {
          local_3b0._0_4_ = SUB84(dVar9,0);
          sVar14 = (size_t)local_3b0._0_4_;
          fwrite(pcVar15,sVar14,1,(FILE *)pRVar3->pfSaveFile);
          fflush((FILE *)pRVar3->pfSaveFile);
        }
        pcVar15 = strstr(recvbuf,"#YPR=");
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar6 = strstr(pcVar15 + 5,"\r\n");
          if (pcVar6 == (char *)0x0) {
            pcVar15 = (char *)0x0;
          }
        }
        if (pcVar15 == (char *)0x0) {
          pcVar6 = (char *)0x0;
        }
        else {
          do {
            pcVar6 = pcVar15;
            pcVar15 = strstr(pcVar6 + 5,"#YPR=");
            if (pcVar15 == (char *)0x0) {
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar7 = strstr(pcVar15 + 5,"\r\n");
              if (pcVar7 == (char *)0x0) {
                pcVar15 = (char *)0x0;
              }
            }
          } while (pcVar15 != (char *)0x0);
        }
        pcVar15 = strstr(recvbuf,"#YPRAG=");
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          pcVar7 = strstr(pcVar15 + 7,"\r\n");
          if (pcVar7 == (char *)0x0) {
            pcVar15 = (char *)0x0;
          }
        }
        if (pcVar15 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          do {
            pcVar7 = pcVar15;
            pcVar15 = strstr(pcVar7 + 7,"#YPRAG=");
            if (pcVar15 == (char *)0x0) {
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar8 = strstr(pcVar15 + 7,"\r\n");
              if (pcVar8 == (char *)0x0) {
                pcVar15 = (char *)0x0;
              }
            }
          } while (pcVar15 != (char *)0x0);
        }
        uVar17 = (ulong)(uint)(iVar4 + SUB84(local_3b0,0));
      } while (pcVar6 == (char *)0x0 && pcVar7 == (char *)0x0);
    }
    pRazorAHRSData->Pitch = 0.0;
    pRazorAHRSData->Yaw = 0.0;
    pRazorAHRSData->gyrz = 0.0;
    pRazorAHRSData->Roll = 0.0;
    pRazorAHRSData->gyrx = 0.0;
    pRazorAHRSData->gyry = 0.0;
    pRazorAHRSData->accy = 0.0;
    pRazorAHRSData->accz = 0.0;
    pRazorAHRSData->roll = 0.0;
    pRazorAHRSData->accx = 0.0;
    pRazorAHRSData->yaw = 0.0;
    pRazorAHRSData->pitch = 0.0;
    if (pcVar7 == (char *)0x0) {
      iVar4 = __isoc99_sscanf(pcVar6,"#YPR=%lf,%lf,%lf",pRazorAHRSData,&pRazorAHRSData->pitch,
                              &pRazorAHRSData->roll);
      if (iVar4 == 3) {
LAB_00105212:
        pRVar3 = local_3a8;
        dVar9 = (pRazorAHRSData->roll * 3.141592653589793) / 180.0;
        local_390 = (pRazorAHRSData->pitch * 3.141592653589793) / 180.0;
        local_3b0 = (pRazorAHRSData->yaw * 3.141592653589793) / 180.0;
        local_3a0 = local_3a8->rollorientation + dVar9;
        local_398 = local_3a8->rollp1;
        dVar9 = cos(dVar9 + local_3a8->rollp2);
        dVar9 = fmod(dVar9 * local_398 + local_3a0,6.283185307179586);
        dVar9 = fmod(dVar9 + 9.42477796076938,6.283185307179586);
        pRazorAHRSData->Roll = dVar9 + -3.141592653589793;
        local_3a0 = pRVar3->pitchorientation + local_390;
        local_398 = pRVar3->pitchp1;
        dVar9 = cos(local_390 + pRVar3->pitchp2);
        dVar9 = fmod(dVar9 * local_398 + local_3a0,6.283185307179586);
        dVar9 = fmod(dVar9 + 9.42477796076938,6.283185307179586);
        pRazorAHRSData->Pitch = dVar9 + -3.141592653589793;
        local_390 = pRVar3->yaworientation + local_3b0;
        local_3a0 = pRVar3->yawp1;
        dVar9 = cos(local_3b0 + pRVar3->yawp2);
        dVar9 = fmod(dVar9 * local_3a0 + local_390,6.283185307179586);
        dVar9 = fmod(dVar9 + 9.42477796076938,6.283185307179586);
        pRazorAHRSData->Yaw = dVar9 + -3.141592653589793;
        pRVar16 = &pRVar3->LastRazorAHRSData;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          pRVar16->yaw = pRazorAHRSData->yaw;
          pRazorAHRSData = (RAZORAHRSDATA *)((long)pRazorAHRSData + (ulong)bVar18 * -0x10 + 8);
          pRVar16 = (RAZORAHRSDATA *)((long)pRVar16 + (ulong)bVar18 * -0x10 + 8);
        }
        return 0;
      }
    }
    else {
      iVar4 = __isoc99_sscanf(pcVar7,"#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",pRazorAHRSData,
                              &pRazorAHRSData->pitch,&pRazorAHRSData->roll,&pRazorAHRSData->accx,
                              &pRazorAHRSData->accy,&pRazorAHRSData->accz,&pRazorAHRSData->gyrx,
                              &pRazorAHRSData->gyry,&pRazorAHRSData->gyrz);
      if (iVar4 == 9) goto LAB_00105212;
    }
    pcVar15 = "Error reading data from a RazorAHRS : Invalid data. ";
  }
  else {
LAB_00104ae6:
    pcVar15 = "Error reading data from a RazorAHRS. ";
  }
  puts(pcVar15);
  return 1;
}

Assistant:

inline int GetLatestDataRazorAHRS(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	char recvbuf[2*MAX_NB_BYTES_RAZORAHRS];
	char savebuf[MAX_NB_BYTES_RAZORAHRS];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_YPR = NULL;
	char* ptr_YPRAG = NULL;
	double roll = 0, pitch = 0, yaw = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_RAZORAHRS-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RazorAHRS. \n");
		return EXIT_FAILURE;
	}
	if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
		fflush(pRazorAHRS->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
			{
				printf("Error reading data from a RazorAHRS : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a RazorAHRS. \n");
				return EXIT_FAILURE;
			}
			if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
				fflush(pRazorAHRS->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
	ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);

	while ((!ptr_YPR)&&(!ptr_YPRAG))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
		{
			printf("Error reading data from a RazorAHRS : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_RAZORAHRS-1)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_RAZORAHRS-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RazorAHRS. \n");
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
		ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);
	}

	// Analyze data.

	memset(pRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (ptr_YPRAG)
	{
		if (sscanf(ptr_YPRAG, "#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll, 
			&pRazorAHRSData->accx, &pRazorAHRSData->accy, &pRazorAHRSData->accz, 
			&pRazorAHRSData->gyrx, &pRazorAHRSData->gyry, &pRazorAHRSData->gyrz) != 9)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sscanf(ptr_YPR, "#YPR=%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll) != 3)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	// Convert orientation information in angles in rad with corrections.

	roll = pRazorAHRSData->roll*M_PI/180.0;
	pitch = pRazorAHRSData->pitch*M_PI/180.0;
	yaw = pRazorAHRSData->yaw*M_PI/180.0;

	// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
	pRazorAHRSData->Roll = fmod_2PI(roll+pRazorAHRS->rollorientation+pRazorAHRS->rollp1*cos(roll+pRazorAHRS->rollp2));
	pRazorAHRSData->Pitch = fmod_2PI(pitch+pRazorAHRS->pitchorientation+pRazorAHRS->pitchp1*cos(pitch+pRazorAHRS->pitchp2));
	pRazorAHRSData->Yaw = fmod_2PI(yaw+pRazorAHRS->yaworientation+pRazorAHRS->yawp1*cos(yaw+pRazorAHRS->yawp2));

	pRazorAHRS->LastRazorAHRSData = *pRazorAHRSData;

	return EXIT_SUCCESS;
}